

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v_basic.c
# Opt level: O3

_Bool test_clear(void)

{
  int n_row;
  long lVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  uint8_t *puVar6;
  uint8_t *memory;
  ulong uVar7;
  uint uVar8;
  _Bool _Var9;
  undefined1 local_68 [8];
  m256v A;
  
  A.e = local_68;
  uVar4 = 0;
  _Var9 = false;
  do {
    n_row = (&DAT_00104690)[uVar4];
    lVar5 = 0;
    puVar6 = A.e;
    do {
      iVar3 = (&DAT_001046b0)[lVar5];
      uVar8 = iVar3 * n_row;
      lVar1 = -((ulong)uVar8 + 0xf & 0xfffffffffffffff0);
      memory = puVar6 + lVar1;
      A.e = puVar6;
      if (0 < (int)uVar8) {
        uVar7 = 0;
        do {
          builtin_memcpy(puVar6 + lVar1 + -8,"\x1f\x1c\x10",4);
          memory[-4] = '\0';
          memory[-3] = '\0';
          memory[-2] = '\0';
          memory[-1] = '\0';
          iVar2 = rand();
          memory[uVar7] = (uint8_t)iVar2;
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
      }
      builtin_memcpy(puVar6 + lVar1 + -8,"A\x1c\x10",4);
      memory[-4] = '\0';
      memory[-3] = '\0';
      memory[-2] = '\0';
      memory[-1] = '\0';
      m256v_make((m256v *)local_68,n_row,iVar3,memory);
      builtin_memcpy(puVar6 + lVar1 + -8,"I\x1c\x10",4);
      memory[-4] = '\0';
      memory[-3] = '\0';
      memory[-2] = '\0';
      memory[-1] = '\0';
      m256v_clear((m256v *)local_68);
      builtin_memcpy(puVar6 + lVar1 + -8,"Q\x1c\x10",4);
      memory[-4] = '\0';
      memory[-3] = '\0';
      memory[-2] = '\0';
      memory[-1] = '\0';
      iVar3 = m256v_iszero((m256v *)local_68);
      if (iVar3 == 0) {
        return _Var9;
      }
      lVar5 = lVar5 + 1;
      puVar6 = A.e;
    } while (lVar5 != 6);
    _Var9 = 4 < uVar4;
    uVar4 = uVar4 + 1;
    if (uVar4 == 6) {
      return true;
    }
  } while( true );
}

Assistant:

static bool test_clear()
{
	const int nrow[] = { 1, 2, 3, 5, 9, 10 };
	const int ncol[] = { 1, 2, 3, 7, 8, 10 };
	for (int ir = 0; ir < array_size(nrow); ++ir) {
		const int nr = nrow[ir];
		for (int ic = 0; ic < array_size(ncol); ++ic) {
			const int nc = ncol[ic];

			/* Create a random matrix, clear it, and verify
			 * it's cleared
			 */
			Def_mat256_rand(A, a, nr, nc, 0xff)
			m256v_clear(&A);
			if (!m256v_iszero(&A))
				return false;
		}
	}

	return true;
}